

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O2

vector<long,_std::allocator<long>_> * __thiscall
libtorrent::torrent_handle::file_progress
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,torrent_handle *this,
          file_progress_flags_t flags)

{
  vector<std::int64_t,_file_index_t> ret;
  _Vector_base<long,_std::allocator<long>_> local_28;
  _Vector_base<long,_std::allocator<long>_> *local_10;
  
  local_10 = &local_28;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sync_call<void(libtorrent::aux::torrent::*)(libtorrent::aux::container_wrapper<long,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<long,std::allocator<long>>>&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::file_progress_flags_tag,void>),std::reference_wrapper<libtorrent::aux::container_wrapper<long,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<long,std::allocator<long>>>>,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::file_progress_flags_tag,void>&>
            (this,0x2e6a7e,
             (reference_wrapper<libtorrent::aux::container_wrapper<long,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<long,_std::allocator<long>_>_>_>
              *)0x0,(bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> *)&local_10);
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = local_28._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = local_28._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_28._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::int64_t> torrent_handle::file_progress(file_progress_flags_t flags) const
	{
		aux::vector<std::int64_t, file_index_t> ret;
		sync_call(&aux::torrent::file_progress, std::ref(ret), flags);
		return TORRENT_RVO(ret);
	}